

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O3

void __thiscall OpenMD::Snapshot::setBoundingBox(Snapshot *this,Mat3x3d *m)

{
  Mat3x3d *pMVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint i;
  long lVar4;
  Mat3x3d *pMVar5;
  long lVar6;
  SquareMatrix3<double> local_58;
  
  pMVar1 = &(this->frameData).bBox;
  if (pMVar1 != m) {
    lVar4 = 0;
    pMVar5 = pMVar1;
    do {
      lVar6 = 0;
      do {
        (pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar6] =
             (((SquareMatrix<double,_3> *)*(double (*) [3])m)->super_RectMatrix<double,_3U,_3U>).
             data_[0][lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar4 = lVar4 + 1;
      pMVar5 = (Mat3x3d *)
               ((pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
      m = (Mat3x3d *)((long)m + 0x18);
    } while (lVar4 != 3);
  }
  SquareMatrix3<double>::inverse(&local_58,pMVar1);
  pMVar1 = &(this->frameData).invBbox;
  if (pMVar1 != &local_58) {
    lVar4 = 0;
    do {
      *(undefined8 *)
       ((long)(this->frameData).invBbox.super_SquareMatrix<double,_3>.
              super_RectMatrix<double,_3U,_3U>.data_[0] + lVar4 + 0x10) =
           *(undefined8 *)
            ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar4 + 0x10);
      uVar3 = *(undefined8 *)
               ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar4 + 8);
      puVar2 = (undefined8 *)
               ((long)(pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar4);
      *puVar2 = *(undefined8 *)
                 ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar4);
      puVar2[1] = uVar3;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x48);
  }
  this->hasBoundingBox = true;
  return;
}

Assistant:

void Snapshot::setBoundingBox(const Mat3x3d& m) {
    frameData.bBox    = m;
    frameData.invBbox = frameData.bBox.inverse();
    hasBoundingBox    = true;
  }